

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_reset_subblock_info(btreeblk_handle *handle)

{
  btreeblk_subblocks *pbVar1;
  btreeblk_subblocks *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (handle->nsb != 0) {
    uVar4 = 0;
    do {
      pbVar1 = handle->sb;
      if (pbVar1[uVar4].bid != 0xffffffffffffffff) {
        pbVar2 = pbVar1 + uVar4;
        if (pbVar2->nblocks != 0) {
          uVar3 = 0;
          do {
            if (pbVar2->bitmap[uVar3] == '\0') {
              filemgr_add_stale_block
                        (handle->file,
                         (ulong)((int)uVar3 * pbVar2->sb_size) +
                         (ulong)handle->nodesize * pbVar2->bid,(ulong)pbVar2->sb_size);
              pbVar1 = handle->sb;
            }
            uVar3 = uVar3 + 1;
            pbVar2 = pbVar1 + uVar4;
          } while (uVar3 < pbVar2->nblocks);
        }
        pbVar2->bid = 0xffffffffffffffff;
      }
      memset(pbVar1[uVar4].bitmap,0,(ulong)pbVar1[uVar4].nblocks);
      uVar4 = uVar4 + 1;
    } while (uVar4 < handle->nsb);
  }
  return;
}

Assistant:

void btreeblk_reset_subblock_info(struct btreeblk_handle *handle)
{
#ifdef __BTREEBLK_SUBBLOCK
    uint32_t sb_no, idx;

    for (sb_no=0;sb_no<handle->nsb;++sb_no){
        if (handle->sb[sb_no].bid != BLK_NOT_FOUND) {
            // first of all, make all unused subblocks as stale
            for (idx=0; idx<handle->sb[sb_no].nblocks; ++idx) {
                if (handle->sb[sb_no].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[sb_no].bid * handle->nodesize)
                            + (idx * handle->sb[sb_no].sb_size),
                        handle->sb[sb_no].sb_size);
                }
            }
            handle->sb[sb_no].bid = BLK_NOT_FOUND;
        }
        // clear all info in each subblock set
        memset(handle->sb[sb_no].bitmap, 0, handle->sb[sb_no].nblocks);
    }
#endif
}